

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uts.c
# Opt level: O2

void uts_initRoot(Node *root,int type)

{
  root->type = type;
  root->height = 0;
  root->numChildren = -1;
  rng_init((root->state).state,rootId);
  if (((byte)debug & 1) == 0) {
    return;
  }
  printf("root node of type %d at %p\n",type,root);
  return;
}

Assistant:

void uts_initRoot(Node * root, int type) {
  root->type = type;
  root->height = 0;
  root->numChildren = -1;      // means not yet determined
  rng_init(root->state.state, rootId);

  if (debug & 1)
    printf("root node of type %d at %p\n",type, root);
}